

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

optional<UniValue> *
InterpretValue(optional<UniValue> *__return_storage_ptr__,KeyInfo *key,string *value,uint flags,
              string *error)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (key->negated == true) {
    if ((flags & 0x20) == 0) {
      if (value == (string *)0x0) {
LAB_002b7d97:
        local_48._M_dataplus._M_p._0_1_ = 0;
      }
      else {
        bVar1 = InterpretBool(value);
        if (bVar1) goto LAB_002b7d97;
        logging_function._M_str = "InterpretValue";
        logging_function._M_len = 0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
        ;
        source_file._M_len = 0x5f;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0x76,ALL,Info,(ConstevalFormatString<2U>)0x40d89b,
                   &key->name,value);
        local_48._M_dataplus._M_p._0_1_ = 1;
      }
      std::_Optional_payload_base<UniValue>::_Optional_payload_base<bool>
                ((_Optional_payload_base<UniValue> *)__return_storage_ptr__);
      goto LAB_002b7e89;
    }
    tinyformat::format<std::__cxx11::string>
              (&local_48,(tinyformat *)"Negating of -%s is meaningless and therefore forbidden",
               (char *)key,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_0000000c,flags));
  }
  else {
    if ((flags & 0x40) == 0 || value != (string *)0x0) {
      if (value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      }
      else {
        std::__cxx11::string::string((string *)&local_48,value);
      }
      std::_Optional_payload_base<UniValue>::_Optional_payload_base<std::__cxx11::string_const>
                ((_Optional_payload_base<UniValue> *)__return_storage_ptr__,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_002b7e89;
    }
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_48,
               (tinyformat *)"Can not set -%s with no value. Please specify value with -%s=value.",
               (char *)key,&key->name,error);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (error,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_engaged = false;
LAB_002b7e89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<common::SettingsValue> InterpretValue(const KeyInfo& key, const std::string* value,
                                                  unsigned int flags, std::string& error)
{
    // Return negated settings as false values.
    if (key.negated) {
        if (flags & ArgsManager::DISALLOW_NEGATION) {
            error = strprintf("Negating of -%s is meaningless and therefore forbidden", key.name);
            return std::nullopt;
        }
        // Double negatives like -nofoo=0 are supported (but discouraged)
        if (value && !InterpretBool(*value)) {
            LogPrintf("Warning: parsed potentially confusing double-negative -%s=%s\n", key.name, *value);
            return true;
        }
        return false;
    }
    if (!value && (flags & ArgsManager::DISALLOW_ELISION)) {
        error = strprintf("Can not set -%s with no value. Please specify value with -%s=value.", key.name, key.name);
        return std::nullopt;
    }
    return value ? *value : "";
}